

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void removePaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  uchar bit_00;
  ulong uStack_50;
  uchar bit;
  size_t x;
  size_t obp;
  size_t ibp;
  size_t diff;
  uint y;
  uint h_local;
  size_t ilinebits_local;
  size_t olinebits_local;
  uchar *in_local;
  uchar *out_local;
  
  ibp = ilinebits - olinebits;
  obp = 0;
  x = 0;
  diff._4_4_ = h;
  _y = ilinebits;
  ilinebits_local = olinebits;
  olinebits_local = (size_t)in;
  in_local = out;
  for (diff._0_4_ = 0; (uint)diff < diff._4_4_; diff._0_4_ = (uint)diff + 1) {
    for (uStack_50 = 0; uStack_50 < ilinebits_local; uStack_50 = uStack_50 + 1) {
      bit_00 = readBitFromReversedStream(&obp,(uchar *)olinebits_local);
      setBitOfReversedStream(&x,in_local,bit_00);
    }
    obp = ibp + obp;
  }
  return;
}

Assistant:

static void removePaddingBits(unsigned char* out, const unsigned char* in,
                              size_t olinebits, size_t ilinebits, unsigned h)
{
  /*
  After filtering there are still padding bits if scanlines have non multiple of 8 bit amounts. They need
  to be removed (except at last scanline of (Adam7-reduced) image) before working with pure image buffers
  for the Adam7 code, the color convert code and the output to the user.
  in and out are allowed to be the same buffer, in may also be higher but still overlapping; in must
  have >= ilinebits*h bits, out must have >= olinebits*h bits, olinebits must be <= ilinebits
  also used to move bits after earlier such operations happened, e.g. in a sequence of reduced images from Adam7
  only useful if (ilinebits - olinebits) is a value in the range 1..7
  */
  unsigned y;
  size_t diff = ilinebits - olinebits;
  size_t ibp = 0, obp = 0; /*input and output bit pointers*/
  for(y = 0; y < h; ++y)
  {
    size_t x;
    for(x = 0; x < olinebits; ++x)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    ibp += diff;
  }
}